

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemFocusable(ImGuiWindow *window,ImGuiID id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  int local_2c;
  bool is_tab_stop;
  ImGuiContext *g;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar3 = false;
  if (id != 0) {
    bVar3 = id == (window->DC).LastItemId;
  }
  if (bVar3) {
    bVar3 = (GImGui->CurrentItemFlags & 5U) == 0;
    (window->DC).FocusCounterRegular = (window->DC).FocusCounterRegular + 1;
    if ((bVar3) &&
       ((window->DC).FocusCounterTabStop = (window->DC).FocusCounterTabStop + 1, pIVar1->NavId == id
       )) {
      pIVar1->NavIdTabCounter = (window->DC).FocusCounterTabStop;
    }
    if ((((pIVar1->ActiveId == id) && ((pIVar1->TabFocusPressed & 1U) != 0)) &&
        (bVar2 = IsActiveIdUsingKey(0), !bVar2)) &&
       (pIVar1->TabFocusRequestNextWindow == (ImGuiWindow *)0x0)) {
      pIVar1->TabFocusRequestNextWindow = window;
      if (((pIVar1->IO).KeyShift & 1U) == 0) {
        local_2c = 1;
      }
      else {
        local_2c = 0;
        if (bVar3) {
          local_2c = -1;
        }
      }
      pIVar1->TabFocusRequestNextCounterTabStop = (window->DC).FocusCounterTabStop + local_2c;
    }
    if (pIVar1->TabFocusRequestCurrWindow == window) {
      if ((window->DC).FocusCounterRegular == pIVar1->TabFocusRequestCurrCounterRegular) {
        (window->DC).LastItemStatusFlags = (window->DC).LastItemStatusFlags | 0x100;
      }
      else if ((bVar3) &&
              ((window->DC).FocusCounterTabStop == pIVar1->TabFocusRequestCurrCounterTabStop)) {
        pIVar1->NavJustTabbedId = id;
        (window->DC).LastItemStatusFlags = (window->DC).LastItemStatusFlags | 0x200;
      }
      else if (pIVar1->ActiveId == id) {
        ClearActiveID();
      }
    }
    return;
  }
  __assert_fail("id != 0 && id == window->DC.LastItemId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0xcc1,"void ImGui::ItemFocusable(ImGuiWindow *, ImGuiID)");
}

Assistant:

void ImGui::ItemFocusable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == window->DC.LastItemId);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.CurrentItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterRegular++;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && !IsActiveIdUsingKey(ImGuiKey_Tab) && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterRegular == g.TabFocusRequestCurrCounterRegular)
        {
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByCode;
            return;
        }
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id;
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}